

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

bool __thiscall glslang::TIntermediate::promoteBinary(TIntermediate *this,TIntermBinary *node)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TQualifier *pTVar5;
  TIntermTyped *node_00;
  TIntermTyped *node_01;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  _func_int **pp_Var6;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  TOperator TVar7;
  ulong uVar8;
  uint local_d0;
  TType local_c8;
  undefined4 extraout_var_23;
  
  TVar7 = (node->super_TIntermOperator).op;
  uVar8 = (ulong)TVar7;
  iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(node);
  node_00 = (TIntermTyped *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])(node);
  node_01 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2a])(node_00);
  if (((((char)iVar2 != '\0') ||
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2a])(node_01),
       (char)iVar2 != '\0')) ||
      (iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00), iVar2 == 0xf)) ||
     (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01), iVar2 == 0xf)) {
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
    bVar1 = TType::operator==((TType *)CONCAT44(extraout_var_01,iVar2),
                              (TType *)CONCAT44(extraout_var_02,iVar3));
    if (!bVar1) {
      return false;
    }
  }
  iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
  (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
            (node,CONCAT44(extraout_var_03,iVar2));
  iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1f])(node);
  pTVar5 = (TQualifier *)
           (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x50))
                     ((long *)CONCAT44(extraout_var_04,iVar2));
  pTVar5->semanticName = (char *)0x0;
  *(ulong *)&pTVar5->field_0x8 = *(ulong *)&pTVar5->field_0x8 & 0xf800001401ff0000;
  TQualifier::clearLayout(pTVar5);
  pTVar5->spirvStorageClass = -1;
  pTVar5->spirvDecorate = (TSpirvDecorate *)0x0;
  *(ulong *)&pTVar5->field_0x8 = *(ulong *)&pTVar5->field_0x8 & 0xe3ffffe7fe00ffff;
  iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2a])(node_00);
  if ((((char)iVar2 != '\0') ||
      (iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00), iVar2 == 0xf)) ||
     (iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00), iVar2 == 0xe)) {
    if (1 < TVar7 - EOpEqual) {
      if (TVar7 != EOpAssign) {
        return false;
      }
      return true;
    }
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if (iVar2 == 0xe) {
      return false;
    }
    TType::TType(&local_c8,EbtBool,EvqTemporary,1,0,0,false);
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (node,&local_c8);
    return true;
  }
  if (((this->source == EShSourceHlsl) &&
      ((iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00), iVar2 == 0xc ||
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01), iVar2 == 0xc))))
     && ((TVar7 - EOpAdd < 10 || (TVar7 - EOpLessThan < 4)))) {
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if (iVar2 == 0xc) {
      node_00 = createConversion(this,EbtInt,node_00);
    }
    iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01);
    if (iVar2 == 0xc) {
      node_01 = createConversion(this,EbtInt,node_01);
    }
    if (node_00 == (TIntermTyped *)0x0) {
      return false;
    }
    if (node_01 == (TIntermTyped *)0x0) {
      return false;
    }
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x30])
              (node,node_00);
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (node,node_01);
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (node,CONCAT44(extraout_var_05,iVar2));
    iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1f])(node);
    pTVar5 = (TQualifier *)
             (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x50))
                       ((long *)CONCAT44(extraout_var_06,iVar2));
    TQualifier::clear(pTVar5);
  }
  switch(TVar7) {
  case EOpAdd:
  case EOpSub:
  case EOpMul:
  case EOpDiv:
switchD_00415e90_caseD_19:
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if (iVar2 == 0xc) {
      return false;
    }
    iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01);
    if (iVar2 == 0xc) {
      return false;
    }
    break;
  case EOpMod:
  case EOpRightShift:
  case EOpLeftShift:
  case EOpAnd:
  case EOpInclusiveOr:
  case EOpExclusiveOr:
switchD_00415e90_caseD_1d:
    if (this->source != EShSourceHlsl) {
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
      if (((((iVar2 - 4U & 0xfffffff9) != 0) && ((iVar2 - 5U & 0xfffffff9) != 0)) &&
          (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])(node_01),
          (iVar2 - 4U & 0xfffffff9) != 0)) && ((iVar2 - 5U & 0xfffffff9) != 0)) {
        return false;
      }
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
      if ((char)iVar2 != '\0') {
        return false;
      }
      iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(node_01);
      if ((char)iVar2 != '\0') {
        return false;
      }
    }
    break;
  case EOpEqual:
  case EOpNotEqual:
    if (this->source == EShSourceHlsl) {
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
      iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
      if (iVar2 < iVar3) {
        iVar2 = iVar3;
      }
      if (1 < iVar2) {
        TVar7 = (TVar7 != EOpEqual) + EOpVectorEqual;
        (node->super_TIntermOperator).op = TVar7;
        uVar8 = (ulong)TVar7;
      }
    }
    else {
      iVar2 = 1;
    }
    goto LAB_0041606e;
  case EOpVectorEqual:
  case EOpVectorNotEqual:
  case EOpComma:
  case EOpVectorTimesScalar:
  case EOpVectorTimesMatrix:
  case EOpMatrixTimesVector:
  case EOpMatrixTimesScalar:
    break;
  case EOpLessThan:
  case EOpGreaterThan:
  case EOpLessThanEqual:
  case EOpGreaterThanEqual:
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if (iVar2 == 0xc) {
      return false;
    }
    goto LAB_00415ea7;
  case EOpLogicalOr:
  case EOpLogicalXor:
  case EOpLogicalAnd:
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    if (iVar2 != 0xc) {
      return false;
    }
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
    if ((char)iVar2 != '\0') {
      return false;
    }
    if ((this->source == EShSourceGlsl) &&
       (iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00),
       (char)iVar2 != '\0')) {
      return false;
    }
LAB_00415ea7:
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
LAB_0041606e:
    TType::TType(&local_c8,EbtBool,EvqTemporary,iVar2,0,0,false);
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (node,&local_c8);
    break;
  default:
    uVar4 = TVar7 - EOpAddAssign;
    if (uVar4 < 0xe) {
      if ((0x3f00U >> (uVar4 & 0x1f) & 1) != 0) goto switchD_00415e90_caseD_1d;
      if ((0x87U >> (uVar4 & 0x1f) & 1) != 0) goto switchD_00415e90_caseD_19;
    }
  }
  local_d0 = (uint)uVar8;
  if (local_d0 < 0x33) {
    if ((0x707f800000000U >> (uVar8 & 0x3f) & 1) != 0) {
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
      iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar1 = TType::operator==((TType *)CONCAT44(extraout_var_07,iVar2),
                                (TType *)CONCAT44(extraout_var_08,iVar3));
      return bVar1;
    }
    if ((0x736000000U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 != 0x1b) goto LAB_004160f2;
    }
    else {
LAB_00416114:
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
      iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
      bVar1 = TType::operator==((TType *)CONCAT44(extraout_var_09,iVar2),
                                (TType *)CONCAT44(extraout_var_10,iVar3));
      if (bVar1) {
        return true;
      }
    }
LAB_00416145:
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if (iVar2 != iVar3) {
      return false;
    }
  }
  else {
LAB_004160f2:
    uVar4 = local_d0 - 0x1e0;
    if (uVar4 < 0xc) {
      if ((0xf83U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_00416114;
      if (uVar4 == 2) goto LAB_00416145;
    }
  }
  iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
  if (((*(byte *)(CONCAT44(extraout_var_11,iVar2) + 10) & 0x60) != 0) ||
     (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
     (*(byte *)(CONCAT44(extraout_var_12,iVar2) + 10) & 0x60) != 0)) {
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    if (((*(byte *)(CONCAT44(extraout_var_13,iVar2) + 10) & 0x60) != 0) &&
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
       (*(byte *)(CONCAT44(extraout_var_14,iVar2) + 10) & 0x60) != 0)) {
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
      iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
      bVar1 = TType::operator==((TType *)CONCAT44(extraout_var_15,iVar2),
                                (TType *)CONCAT44(extraout_var_16,iVar3));
      if (!bVar1) {
        return false;
      }
    }
    if ((int)local_d0 < 0x1c) {
      if (local_d0 - 0x19 < 2) {
LAB_004162f8:
        iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        if ((*(byte *)(CONCAT44(extraout_var_24,iVar2) + 10) & 0x60) == 0) {
          return false;
        }
        iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        return (*(byte *)(CONCAT44(extraout_var_25,iVar2) + 10) & 0x60) != 0;
      }
      if (local_d0 != 0x1b) {
        return false;
      }
    }
    else {
      if ((local_d0 == 0x1c) || (local_d0 == 0x1df)) goto LAB_004162f8;
      if (local_d0 != 0x1e2) {
        return false;
      }
    }
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    if (((*(byte *)(CONCAT44(extraout_var_17,iVar2) + 10) & 0x20) != 0) &&
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
       (*(byte *)(CONCAT44(extraout_var_18,iVar2) + 10) & 0x20) != 0)) {
      return false;
    }
    if ((local_d0 == 0x1e2) &&
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
       (*(byte *)(CONCAT44(extraout_var_19,iVar2) + 10) & 0x20) != 0)) {
      return false;
    }
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    if (((*(byte *)(CONCAT44(extraout_var_20,iVar2) + 10) & 0x60) == 0) ||
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
       (*(byte *)(CONCAT44(extraout_var_21,iVar2) + 10) & 0x60) == 0)) {
      TVar7 = EOpMatrixTimesScalar;
      if (local_d0 == 0x1e2) {
        TVar7 = EOpMatrixTimesScalarAssign;
      }
      (node->super_TIntermOperator).op = TVar7;
    }
    iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
    if ((*(byte *)(CONCAT44(extraout_var_22,iVar2) + 10) & 0x60) == 0) {
      return true;
    }
    pp_Var6 = (node_01->super_TIntermNode)._vptr_TIntermNode;
LAB_004162de:
    iVar2 = (*pp_Var6[0x1e])(node_01);
    (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (node,CONCAT44(extraout_var_23,iVar2));
    return true;
  }
  iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
  if (((*(byte *)(CONCAT44(extraout_var_26,iVar2) + 0xb) & 8) != 0) ||
     (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
     (*(byte *)(CONCAT44(extraout_var_27,iVar2) + 0xb) & 8) != 0)) {
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    if (((*(byte *)(CONCAT44(extraout_var_28,iVar2) + 0xb) & 8) != 0) &&
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01),
       (*(byte *)(CONCAT44(extraout_var_29,iVar2) + 0xb) & 8) != 0)) {
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
      iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
      bVar1 = TType::operator==((TType *)CONCAT44(extraout_var_30,iVar2),
                                (TType *)CONCAT44(extraout_var_31,iVar3));
      if (!bVar1) {
        return false;
      }
    }
    if ((int)local_d0 < 0x1df) {
      if (0x1f < local_d0) {
        return false;
      }
      if ((0xd6000000U >> (local_d0 & 0x1f) & 1) != 0) {
LAB_00416595:
        iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        if ((*(byte *)(CONCAT44(extraout_var_35,iVar2) + 0xb) & 8) == 0) {
          return false;
        }
        iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        return (bool)((*(byte *)(CONCAT44(extraout_var_36,iVar2) + 0xb) & 8) >> 3);
      }
      if (local_d0 != 0x1b) {
        return false;
      }
    }
    else {
      if ((local_d0 - 0x1ec < 2) || (local_d0 == 0x1df)) goto LAB_00416595;
      if (local_d0 != 0x1e2) {
        return false;
      }
    }
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
    if (((*(byte *)(CONCAT44(extraout_var_32,iVar2) + 0xb) & 8) == 0) ||
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(),
       (*(byte *)(CONCAT44(extraout_var_33,iVar2) + 0xb) & 8) == 0)) {
      TVar7 = EOpVectorTimesScalar;
      if (local_d0 == 0x1e2) {
        TVar7 = EOpVectorTimesScalarAssign;
      }
      (node->super_TIntermOperator).op = TVar7;
    }
    iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_01);
    if ((*(byte *)(CONCAT44(extraout_var_34,iVar2) + 0xb) & 8) == 0) {
      return true;
    }
    pp_Var6 = (node_01->super_TIntermNode)._vptr_TIntermNode;
    goto LAB_004162de;
  }
  iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2c])(node_00);
  if (((char)iVar2 != '\0') &&
     (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2c])(), (char)iVar2 != '\0')) {
    return true;
  }
  iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
  if (((char)iVar2 != '\0') &&
     (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (char)iVar2 != '\0')) {
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
    if ((iVar2 != iVar3) &&
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])(), 1 < iVar2)) {
      return false;
    }
  }
  t = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
  switch(local_d0) {
  case 0x1df:
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
    if (iVar2 != iVar3) {
      return false;
    }
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
    if (iVar2 != iVar3) {
      return false;
    }
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
    if (iVar2 != iVar3) {
      return false;
    }
    break;
  case 0x1e0:
  case 0x1e1:
  case 0x1e7:
  case 0x1e8:
  case 0x1e9:
  case 0x1ea:
  case 0x1eb:
    break;
  case 0x1e2:
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
    if (((char)iVar2 == '\0') &&
       (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar2 != '\0')) {
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
      if ((char)iVar2 == '\0') {
        return false;
      }
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
      iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
      if (iVar2 != iVar3) {
        return false;
      }
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
      iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
      if (iVar2 != iVar3) {
        return false;
      }
      (node->super_TIntermOperator).op = EOpVectorTimesMatrixAssign;
      local_d0 = 0x1e3;
    }
    else {
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
      if (((char)iVar2 == '\0') ||
         (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar2 != '\0')) {
        iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
        if (((char)iVar2 == '\0') ||
           (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar2 == '\0'))
        {
          iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
          if ((char)iVar2 != '\0') {
            return false;
          }
          iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])();
          if ((char)iVar2 != '\0') {
            return false;
          }
          iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
          if ((char)iVar2 != '\0') {
            iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
            local_d0 = 0x1e2;
            if ((char)iVar2 != '\0') goto LAB_00416d76;
          }
          iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
          if ((char)iVar2 == '\0') {
            iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
            local_d0 = 0x1e2;
            if ((char)iVar2 == '\0') goto LAB_00416d76;
          }
          iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
          if ((char)iVar2 == '\0') {
            return false;
          }
          (node->super_TIntermOperator).op = EOpVectorTimesScalarAssign;
          local_d0 = 0x1e4;
        }
        else {
          iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
          iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
          if (iVar2 != iVar3) {
            return false;
          }
          iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
          iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
          if (iVar2 != iVar3) {
            return false;
          }
          (node->super_TIntermOperator).op = EOpMatrixTimesMatrixAssign;
          local_d0 = 0x1e6;
        }
      }
      else {
        iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
        if ((char)iVar2 != '\0') {
          return false;
        }
        (node->super_TIntermOperator).op = EOpMatrixTimesScalarAssign;
        local_d0 = 0x1e5;
      }
    }
    goto LAB_00416d76;
  case 0x1e3:
  case 0x1e4:
  case 0x1e5:
  case 0x1e6:
    goto switchD_00416417_caseD_1e3;
  case 0x1ec:
  case 0x1ed:
switchD_00416417_caseD_1ec:
    iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
    if ((char)iVar2 != '\0') {
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
      if ((char)iVar2 == '\0') {
        return false;
      }
      iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
      if (iVar2 != iVar3) {
        return false;
      }
    }
    goto LAB_00416d76;
  default:
    if (0x22 < local_d0) {
      return false;
    }
    if ((0x736000000U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0xc0000000UL >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 != 0x1b) {
          return false;
        }
        iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
        if (((char)iVar2 == '\0') &&
           (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar2 != '\0'))
        {
          iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
          if ((char)iVar2 != '\0') {
            iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
            iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
            if (iVar2 != iVar3) {
              return false;
            }
            (node->super_TIntermOperator).op = EOpVectorTimesMatrix;
            iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
            TType::TType(&local_c8,t,EvqTemporary,iVar2,0,0,false);
            (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1d])(node,&local_c8);
            local_d0 = 0x2d;
            goto LAB_00416d76;
          }
          (node->super_TIntermOperator).op = EOpMatrixTimesScalar;
          iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])(node_01);
          iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])(node_01);
          TType::TType(&local_c8,t,EvqTemporary,0,iVar2,iVar3,false);
          (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(node,&local_c8);
        }
        else {
          iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
          if (((char)iVar2 == '\0') ||
             (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar2 != '\0'
             )) {
            iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
            if (((char)iVar2 == '\0') ||
               (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(),
               (char)iVar2 == '\0')) {
              iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
              if ((char)iVar2 != '\0') {
                return false;
              }
              iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])();
              if ((char)iVar2 != '\0') {
                return false;
              }
              iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
              if ((char)iVar2 != '\0') {
                iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                local_d0 = 0x1b;
                if ((char)iVar2 != '\0') goto LAB_00416d76;
              }
              iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
              if ((char)iVar2 == '\0') {
                iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                local_d0 = 0x1b;
                if ((char)iVar2 == '\0') goto LAB_00416d76;
              }
              (node->super_TIntermOperator).op = EOpVectorTimesScalar;
              iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
              local_d0 = 0x2c;
              if ((char)iVar2 != '\0') {
                iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
                TType::TType(&local_c8,t,EvqTemporary,iVar2,0,0,false);
                (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1d])(node,&local_c8);
              }
            }
            else {
              iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
              iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
              if (iVar2 != iVar3) {
                return false;
              }
              (node->super_TIntermOperator).op = EOpMatrixTimesMatrix;
              iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
              TType::TType(&local_c8,t,EvqTemporary,0,iVar2,iVar3,false);
              (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x1d])(node,&local_c8);
              local_d0 = 0xa6;
            }
            goto LAB_00416d76;
          }
          iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
          if ((char)iVar2 != '\0') {
            iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
            iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
            if (iVar2 != iVar3) {
              return false;
            }
            (node->super_TIntermOperator).op = EOpMatrixTimesVector;
            iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
            TType::TType(&local_c8,t,EvqTemporary,iVar2,0,0,false);
            (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1d])(node,&local_c8);
            local_d0 = 0x2e;
            goto LAB_00416d76;
          }
          (node->super_TIntermOperator).op = EOpMatrixTimesScalar;
        }
        local_d0 = 0x2f;
        goto LAB_00416d76;
      }
      goto switchD_00416417_caseD_1ec;
    }
  }
  iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
  if ((((char)iVar2 == '\0') ||
      (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (char)iVar2 == '\0')) &&
     ((iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00), (char)iVar2 == '\0'
      || (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar2 == '\0'))))
  {
    iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
    iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if (iVar2 == iVar3) {
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
      if (((char)iVar2 != '\0') &&
         (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar2 != '\0')) {
        iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
        iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x27])();
        if (iVar2 != iVar3) {
          return false;
        }
        iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
        iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x28])();
        if (iVar2 != iVar3) {
          return false;
        }
      }
      iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
      if (((char)iVar2 != '\0') &&
         (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (char)iVar2 != '\0')) {
        iVar2 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
        iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x26])();
        if (iVar2 != iVar3) {
          return false;
        }
      }
      iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x2b])();
      if (((char)iVar2 != '\0') ||
         (iVar2 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x29])(), (char)iVar2 != '\0')) {
        iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1f])(node);
        iVar3 = (*(node_01->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        TType::shallowCopy((TType *)CONCAT44(extraout_var_37,iVar2),
                           (TType *)CONCAT44(extraout_var_38,iVar3));
        iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1f])(node);
        pTVar5 = (TQualifier *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_39,iVar2) + 0x50))
                           ((long *)CONCAT44(extraout_var_39,iVar2));
        TQualifier::makeTemporary(pTVar5);
      }
LAB_00416d76:
      if ((local_d0 - 0x1df < 0xf) && ((0x7f0fU >> (local_d0 - 0x1df & 0x1f) & 1) != 0)) {
        iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(node);
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(node_00);
        bVar1 = TType::operator==((TType *)CONCAT44(extraout_var_40,iVar2),
                                  (TType *)CONCAT44(extraout_var_41,iVar3));
        if (!bVar1) {
          return false;
        }
      }
      return true;
    }
  }
switchD_00416417_caseD_1e3:
  return false;
}

Assistant:

bool TIntermediate::promoteBinary(TIntermBinary& node)
{
    TOperator     op    = node.getOp();
    TIntermTyped* left  = node.getLeft();
    TIntermTyped* right = node.getRight();

    // Arrays and structures have to be exact matches.
    if ((left->isArray() || right->isArray() || left->getBasicType() == EbtStruct || right->getBasicType() == EbtStruct)
        && left->getType() != right->getType())
        return false;

    // Base assumption:  just make the type the same as the left
    // operand.  Only deviations from this will be coded.
    node.setType(left->getType());
    node.getWritableType().getQualifier().clear();

    // Composite and opaque types don't having pending operator changes, e.g.,
    // array, structure, and samplers.  Just establish final type and correctness.
    if (left->isArray() || left->getBasicType() == EbtStruct || left->getBasicType() == EbtSampler) {
        switch (op) {
        case EOpEqual:
        case EOpNotEqual:
            if (left->getBasicType() == EbtSampler) {
                // can't compare samplers
                return false;
            } else {
                // Promote to conditional
                node.setType(TType(EbtBool));
            }

            return true;

        case EOpAssign:
            // Keep type from above

            return true;

        default:
            return false;
        }
    }

    //
    // We now have only scalars, vectors, and matrices to worry about.
    //

    // HLSL implicitly promotes bool -> int for numeric operations.
    // (Implicit conversions to make the operands match each other's types were already done.)
    if (getSource() == EShSourceHlsl &&
        (left->getBasicType() == EbtBool || right->getBasicType() == EbtBool)) {
        switch (op) {
        case EOpLessThan:
        case EOpGreaterThan:
        case EOpLessThanEqual:
        case EOpGreaterThanEqual:

        case EOpRightShift:
        case EOpLeftShift:

        case EOpMod:

        case EOpAnd:
        case EOpInclusiveOr:
        case EOpExclusiveOr:

        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpMul:
            if (left->getBasicType() == EbtBool)
                left  = createConversion(EbtInt, left);
            if (right->getBasicType() == EbtBool)
                right = createConversion(EbtInt, right);
            if (left == nullptr || right == nullptr)
                return false;
            node.setLeft(left);
            node.setRight(right);

            // Update the original base assumption on result type..
            node.setType(left->getType());
            node.getWritableType().getQualifier().clear();

            break;

        default:
            break;
        }
    }

    // Do general type checks against individual operands (comparing left and right is coming up, checking mixed shapes after that)
    switch (op) {
    case EOpLessThan:
    case EOpGreaterThan:
    case EOpLessThanEqual:
    case EOpGreaterThanEqual:
        // Relational comparisons need numeric types and will promote to scalar Boolean.
        if (left->getBasicType() == EbtBool)
            return false;

        node.setType(TType(EbtBool, EvqTemporary, left->getVectorSize()));
        break;

    case EOpEqual:
    case EOpNotEqual:
        if (getSource() == EShSourceHlsl) {
            const int resultWidth = std::max(left->getVectorSize(), right->getVectorSize());

            // In HLSL, == or != on vectors means component-wise comparison.
            if (resultWidth > 1) {
                op = (op == EOpEqual) ? EOpVectorEqual : EOpVectorNotEqual;
                node.setOp(op);
            }

            node.setType(TType(EbtBool, EvqTemporary, resultWidth));
        } else {
            // All the above comparisons result in a bool (but not the vector compares)
            node.setType(TType(EbtBool));
        }
        break;

    case EOpLogicalAnd:
    case EOpLogicalOr:
    case EOpLogicalXor:
        // logical ops operate only on Booleans or vectors of Booleans.
        if (left->getBasicType() != EbtBool || left->isMatrix())
                return false;

        if (getSource() == EShSourceGlsl) {
            // logical ops operate only on scalar Booleans and will promote to scalar Boolean.
            if (left->isVector())
                return false;
        }

        node.setType(TType(EbtBool, EvqTemporary, left->getVectorSize()));
        break;

    case EOpRightShift:
    case EOpLeftShift:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:

    case EOpMod:
    case EOpModAssign:

    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
        if (getSource() == EShSourceHlsl)
            break;

        // Check for integer-only operands.
        if (!isTypeInt(left->getBasicType()) && !isTypeInt(right->getBasicType()))
            return false;
        if (left->isMatrix() || right->isMatrix())
            return false;

        break;

    case EOpAdd:
    case EOpSub:
    case EOpDiv:
    case EOpMul:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpMulAssign:
    case EOpDivAssign:
        // check for non-Boolean operands
        if (left->getBasicType() == EbtBool || right->getBasicType() == EbtBool)
            return false;
        break;

    default:
        break;
    }

    // Compare left and right, and finish with the cases where the operand types must match
    switch (op) {
    case EOpLessThan:
    case EOpGreaterThan:
    case EOpLessThanEqual:
    case EOpGreaterThanEqual:

    case EOpEqual:
    case EOpNotEqual:
    case EOpVectorEqual:
    case EOpVectorNotEqual:

    case EOpLogicalAnd:
    case EOpLogicalOr:
    case EOpLogicalXor:
        return left->getType() == right->getType();

    case EOpMod:
    case EOpModAssign:

    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:

    case EOpAdd:
    case EOpSub:
    case EOpDiv:

    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
        // Quick out in case the types do match
        if (left->getType() == right->getType())
            return true;

        [[fallthrough]];

    case EOpMul:
    case EOpMulAssign:
        // At least the basic type has to match
        if (left->getBasicType() != right->getBasicType())
            return false;
        break;

    default:
        break;
    }

    if (left->getType().isCoopMat() || right->getType().isCoopMat()) {
        // Operations on two cooperative matrices must have identical types
        if (left->getType().isCoopMat() && right->getType().isCoopMat() &&
            left->getType() != right->getType()) {
            return false;
        }
        switch (op) {
        case EOpMul:
        case EOpMulAssign:
            // Mul not supported in NV_cooperative_matrix
            if (left->getType().isCoopMatNV() && right->getType().isCoopMatNV()) {
                return false;
            }
            // NV_cooperative_matrix supports MulAssign is for mat*=scalar only.
            // KHR_cooperative_matrix supports it for mat*=mat as well.
            if (op == EOpMulAssign && right->getType().isCoopMatNV()) {
                return false;
            }
            // Use MatrixTimesScalar if either operand is not a matrix. Otherwise use Mul.
            if (!left->getType().isCoopMat() || !right->getType().isCoopMat()) {
                node.setOp(op == EOpMulAssign ? EOpMatrixTimesScalarAssign : EOpMatrixTimesScalar);
            }
            // In case of scalar*matrix, take the result type from the matrix.
            if (right->getType().isCoopMat()) {
                node.setType(right->getType());
            }
            return true;
        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpAssign:
            // These require both to be cooperative matrices
            if (!left->getType().isCoopMat() || !right->getType().isCoopMat()) {
                return false;
            }
            return true;
        default:
            break;
        }
        return false;
    }

    if (left->getType().isCoopVecNV() || right->getType().isCoopVecNV()) {
        // Operations on two cooperative vectors must have identical types
        if (left->getType().isCoopVecNV() && right->getType().isCoopVecNV() &&
            left->getType() != right->getType()) {
            return false;
        }
        switch (op) {
        case EOpMul:
        case EOpMulAssign:
            // Use VectorTimesScalar if either operand is not a vector. Otherwise use Mul.
            if (!left->getType().isCoopVecNV() || !right->getType().isCoopVecNV()) {
                node.setOp(op == EOpMulAssign ? EOpVectorTimesScalarAssign : EOpVectorTimesScalar);
            }
            // In case of scalar*vector, take the result type from the vector.
            if (right->getType().isCoopVecNV()) {
                node.setType(right->getType());
            }
            return true;
        case EOpLeftShift:
        case EOpLeftShiftAssign:
        case EOpRightShift:
        case EOpRightShiftAssign:
        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpAssign:
            // These require both to be cooperative vectors
            if (!left->getType().isCoopVecNV() || !right->getType().isCoopVecNV()) {
                return false;
            }
            return true;
        default:
            break;
        }
        return false;
    }

    // Finish handling the case, for all ops, where both operands are scalars.
    if (left->isScalar() && right->isScalar())
        return true;

    // Finish handling the case, for all ops, where there are two vectors of different sizes
    if (left->isVector() && right->isVector() && left->getVectorSize() != right->getVectorSize() && right->getVectorSize() > 1)
        return false;

    //
    // We now have a mix of scalars, vectors, or matrices, for non-relational operations.
    //

    // Can these two operands be combined, what is the resulting type?
    TBasicType basicType = left->getBasicType();
    switch (op) {
    case EOpMul:
        if (!left->isMatrix() && right->isMatrix()) {
            if (left->isVector()) {
                if (left->getVectorSize() != right->getMatrixRows())
                    return false;
                node.setOp(op = EOpVectorTimesMatrix);
                node.setType(TType(basicType, EvqTemporary, right->getMatrixCols()));
            } else {
                node.setOp(op = EOpMatrixTimesScalar);
                node.setType(TType(basicType, EvqTemporary, 0, right->getMatrixCols(), right->getMatrixRows()));
            }
        } else if (left->isMatrix() && !right->isMatrix()) {
            if (right->isVector()) {
                if (left->getMatrixCols() != right->getVectorSize())
                    return false;
                node.setOp(op = EOpMatrixTimesVector);
                node.setType(TType(basicType, EvqTemporary, left->getMatrixRows()));
            } else {
                node.setOp(op = EOpMatrixTimesScalar);
            }
        } else if (left->isMatrix() && right->isMatrix()) {
            if (left->getMatrixCols() != right->getMatrixRows())
                return false;
            node.setOp(op = EOpMatrixTimesMatrix);
            node.setType(TType(basicType, EvqTemporary, 0, right->getMatrixCols(), left->getMatrixRows()));
        } else if (! left->isMatrix() && ! right->isMatrix()) {
            if (left->isVector() && right->isVector()) {
                ; // leave as component product
            } else if (left->isVector() || right->isVector()) {
                node.setOp(op = EOpVectorTimesScalar);
                if (right->isVector())
                    node.setType(TType(basicType, EvqTemporary, right->getVectorSize()));
            }
        } else {
            return false;
        }
        break;
    case EOpMulAssign:
        if (! left->isMatrix() && right->isMatrix()) {
            if (left->isVector()) {
                if (left->getVectorSize() != right->getMatrixRows() || left->getVectorSize() != right->getMatrixCols())
                    return false;
                node.setOp(op = EOpVectorTimesMatrixAssign);
            } else {
                return false;
            }
        } else if (left->isMatrix() && !right->isMatrix()) {
            if (right->isVector()) {
                return false;
            } else {
                node.setOp(op = EOpMatrixTimesScalarAssign);
            }
        } else if (left->isMatrix() && right->isMatrix()) {
            if (left->getMatrixCols() != right->getMatrixCols() || left->getMatrixCols() != right->getMatrixRows())
                return false;
            node.setOp(op = EOpMatrixTimesMatrixAssign);
        } else if (!left->isMatrix() && !right->isMatrix()) {
            if (left->isVector() && right->isVector()) {
                // leave as component product
            } else if (left->isVector() || right->isVector()) {
                if (! left->isVector())
                    return false;
                node.setOp(op = EOpVectorTimesScalarAssign);
            }
        } else {
            return false;
        }
        break;

    case EOpRightShift:
    case EOpLeftShift:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:
        if (right->isVector() && (! left->isVector() || right->getVectorSize() != left->getVectorSize()))
            return false;
        break;

    case EOpAssign:
        if (left->getVectorSize() != right->getVectorSize() || left->getMatrixCols() != right->getMatrixCols() || left->getMatrixRows() != right->getMatrixRows())
            return false;
        [[fallthrough]];

    case EOpAdd:
    case EOpSub:
    case EOpDiv:
    case EOpMod:
    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
    case EOpModAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:

        if ((left->isMatrix() && right->isVector()) ||
            (left->isVector() && right->isMatrix()) ||
            left->getBasicType() != right->getBasicType())
            return false;
        if (left->isMatrix() && right->isMatrix() && (left->getMatrixCols() != right->getMatrixCols() || left->getMatrixRows() != right->getMatrixRows()))
            return false;
        if (left->isVector() && right->isVector() && left->getVectorSize() != right->getVectorSize())
            return false;
        if (right->isVector() || right->isMatrix()) {
            node.getWritableType().shallowCopy(right->getType());
            node.getWritableType().getQualifier().makeTemporary();
        }
        break;

    default:
        return false;
    }

    //
    // One more check for assignment.
    //
    switch (op) {
    // The resulting type has to match the left operand.
    case EOpAssign:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpMulAssign:
    case EOpDivAssign:
    case EOpModAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
    case EOpLeftShiftAssign:
    case EOpRightShiftAssign:
        if (node.getType() != left->getType())
            return false;
        break;
    default:
        break;
    }

    return true;
}